

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_proxy_delete_property(JSContext *ctx,JSValue obj,JSAtom atom)

{
  short extraout_AX;
  int iVar1;
  int iVar2;
  JSProxyData *pJVar3;
  JSRefCountHeader *p;
  JSValue JVar4;
  JSValue JVar5;
  JSValue method;
  JSPropertyDescriptor desc;
  JSValueUnion local_a0;
  int64_t local_98;
  JSPropertyDescriptor local_90;
  JSValueUnion local_58;
  int64_t iStack_50;
  JSValue local_48;
  
  pJVar3 = get_proxy_method(ctx,(JSValue *)&local_a0,obj,100);
  if (pJVar3 == (JSProxyData *)0x0) {
    return -1;
  }
  if ((uint)local_98 == 3) {
    iVar1 = JS_DeleteProperty(ctx,pJVar3->target,atom,0);
    return iVar1;
  }
  JVar4 = __JS_AtomToValue(ctx,atom,0);
  if ((uint)JVar4.tag == 6) {
    if ((uint)local_98 < 0xfffffff5) {
      return -1;
    }
    iVar1 = *local_a0.ptr;
    *(int *)local_a0.ptr = iVar1 + -1;
    if (1 < iVar1) {
      return -1;
    }
    JVar4.tag = local_98;
    JVar4.u.ptr = local_a0.ptr;
    __JS_FreeValueRT(ctx->rt,JVar4);
    return -1;
  }
  local_58.ptr = *(void **)&(pJVar3->target).u;
  iStack_50 = (pJVar3->target).tag;
  JVar5.tag = local_98;
  JVar5.u.ptr = local_a0.ptr;
  local_48 = JVar4;
  JVar5 = JS_CallFree(ctx,JVar5,pJVar3->handler,2,(JSValue *)&local_58);
  if ((0xfffffff4 < (uint)JVar4.tag) &&
     (iVar1 = *JVar4.u.ptr, *(int *)JVar4.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar4);
  }
  if ((int)JVar5.tag == 6) {
    return -1;
  }
  iVar1 = JS_ToBoolFree(ctx,JVar5);
  if (iVar1 == 0) {
    return 0;
  }
  iVar2 = JS_GetOwnPropertyInternal(ctx,&local_90,(JSObject *)(pJVar3->target).u.ptr,atom);
  if (iVar2 < 0) {
    return -1;
  }
  if (iVar2 == 0) {
    return iVar1;
  }
  if (((byte)local_90.flags & 1) != 0) {
    js_proxy_delete_property_cold_1();
    if (extraout_AX == 0) goto LAB_00143b47;
    if (extraout_AX != 1) {
      return iVar1;
    }
  }
  JS_ThrowTypeError(ctx,"proxy: inconsistent deleteProperty");
LAB_00143b47:
  js_free_desc(ctx,&local_90);
  return -1;
}

Assistant:

static int js_proxy_delete_property(JSContext *ctx, JSValueConst obj,
                                    JSAtom atom)
{
    JSProxyData *s;
    JSValue method, ret, atom_val;
    int res, res2, is_extensible;
    JSValueConst args[2];

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_deleteProperty);
    if (!s)
        return -1;
    if (JS_IsUndefined(method)) {
        return JS_DeleteProperty(ctx, s->target, atom, 0);
    }
    atom_val = JS_AtomToValue(ctx, atom);;
    if (JS_IsException(atom_val)) {
        JS_FreeValue(ctx, method);
        return -1;
    }
    args[0] = s->target;
    args[1] = atom_val;
    ret = JS_CallFree(ctx, method, s->handler, 2, args);
    JS_FreeValue(ctx, atom_val);
    if (JS_IsException(ret))
        return -1;
    res = JS_ToBoolFree(ctx, ret);
    if (res) {
        JSPropertyDescriptor desc;
        res2 = JS_GetOwnPropertyInternal(ctx, &desc, JS_VALUE_GET_OBJ(s->target), atom);
        if (res2 < 0)
            return -1;
        if (res2) {
            if (!(desc.flags & JS_PROP_CONFIGURABLE))
                goto fail;
            is_extensible = JS_IsExtensible(ctx, s->target);
            if (is_extensible < 0)
                goto fail1;
            if (!is_extensible) {
                /* proxy-missing-checks */
            fail:
                JS_ThrowTypeError(ctx, "proxy: inconsistent deleteProperty");
            fail1:
                js_free_desc(ctx, &desc);
                return -1;
            }
            js_free_desc(ctx, &desc);
        }
    }
    return res;
}